

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

cmGlobalGenerator * __thiscall cmake::CreateGlobalGenerator(cmake *this,string *gname)

{
  cmExternalMakefileProjectGeneratorFactory *this_00;
  pointer pcVar1;
  pointer ppcVar2;
  _Alloc_hider _Var3;
  pointer pbVar4;
  cmExternalMakefileProjectGenerator *extraGenerator;
  int iVar5;
  pointer ppcVar6;
  undefined4 extraout_var;
  cmGlobalGenerator *this_01;
  undefined4 extraout_var_01;
  undefined8 uVar7;
  pointer ppcVar8;
  string *globalGenerator;
  bool bVar9;
  string name;
  RegisteredGeneratorsVector *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generators;
  pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extra;
  string local_c8;
  cmake *local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  cmExternalMakefileProjectGenerator *local_88;
  long *local_80;
  long local_78;
  long local_70 [2];
  pointer local_60;
  pointer local_58;
  string local_50;
  undefined4 extraout_var_00;
  
  ppcVar6 = (this->ExtraGenerators).
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_60 = (this->ExtraGenerators).
             super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_a8 = this;
  if (ppcVar6 != local_60) {
    do {
      this_00 = *ppcVar6;
      local_58 = ppcVar6;
      cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
                (&local_a0,this_00);
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_c8,this_00);
      _Var3._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_string_length == gname->_M_string_length) {
        if (local_c8._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar5 = bcmp(local_c8._M_dataplus._M_p,(gname->_M_dataplus)._M_p,local_c8._M_string_length
                      );
          bVar9 = iVar5 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != &local_c8.field_2) {
        operator_delete(_Var3._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      pbVar4 = local_a0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      globalGenerator =
           local_a0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if (bVar9) {
        iVar5 = (*this_00->_vptr_cmExternalMakefileProjectGeneratorFactory[2])(this_00);
        local_88 = (cmExternalMakefileProjectGenerator *)CONCAT44(extraout_var_01,iVar5);
        if (local_a0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_a0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar7 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0,0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a0);
          _Unwind_Resume(uVar7);
        }
        local_80 = local_70;
        pcVar1 = ((local_a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,pcVar1,
                   pcVar1 + (local_a0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
LAB_00216fc7:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a0);
        goto LAB_00216fd1;
      }
      for (; globalGenerator != pbVar4; globalGenerator = globalGenerator + 1) {
        cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_50,this_00);
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  (&local_c8,globalGenerator,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        _Var3._M_p = local_c8._M_dataplus._M_p;
        if ((local_c8._M_string_length == gname->_M_string_length) &&
           ((local_c8._M_string_length == 0 ||
            (iVar5 = bcmp(local_c8._M_dataplus._M_p,(gname->_M_dataplus)._M_p,
                          local_c8._M_string_length), iVar5 == 0)))) {
          iVar5 = (*this_00->_vptr_cmExternalMakefileProjectGeneratorFactory[2])(this_00);
          local_88 = (cmExternalMakefileProjectGenerator *)CONCAT44(extraout_var,iVar5);
          local_80 = local_70;
          pcVar1 = (globalGenerator->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,pcVar1,pcVar1 + globalGenerator->_M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00216fc7;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var3._M_p != &local_c8.field_2) {
          operator_delete(_Var3._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a0);
      ppcVar6 = local_58 + 1;
    } while (ppcVar6 != local_60);
  }
  local_88 = (cmExternalMakefileProjectGenerator *)0x0;
  local_80 = local_70;
  pcVar1 = (gname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + gname->_M_string_length);
LAB_00216fd1:
  extraGenerator = local_88;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_80,local_78 + (long)local_80);
  ppcVar8 = (local_a8->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppcVar2 = (local_a8->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppcVar8 == ppcVar2) {
      if (extraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
        (*extraGenerator->_vptr_cmExternalMakefileProjectGenerator[1])(extraGenerator);
      }
      this_01 = (cmGlobalGenerator *)0x0;
LAB_00217048:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      return this_01;
    }
    iVar5 = (*(*ppcVar8)->_vptr_cmGlobalGeneratorFactory[2])(*ppcVar8,&local_c8,local_a8);
    this_01 = (cmGlobalGenerator *)CONCAT44(extraout_var_00,iVar5);
    if (this_01 != (cmGlobalGenerator *)0x0) {
      cmGlobalGenerator::SetExternalMakefileProjectGenerator(this_01,extraGenerator);
      goto LAB_00217048;
    }
    ppcVar8 = ppcVar8 + 1;
  } while( true );
}

Assistant:

cmGlobalGenerator* cmake::CreateGlobalGenerator(const std::string& gname)
{
  std::pair<cmExternalMakefileProjectGenerator*, std::string> extra =
    createExtraGenerator(this->ExtraGenerators, gname);
  cmExternalMakefileProjectGenerator* extraGenerator = extra.first;
  const std::string name = extra.second;

  cmGlobalGenerator* generator = nullptr;
  for (cmGlobalGeneratorFactory* g : this->Generators) {
    generator = g->CreateGlobalGenerator(name, this);
    if (generator) {
      break;
    }
  }

  if (generator) {
    generator->SetExternalMakefileProjectGenerator(extraGenerator);
  } else {
    delete extraGenerator;
  }

  return generator;
}